

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

int __thiscall
jsoncons::jsonpath::detail::
identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  wchar_t *pwVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  const_object_range_type *pcVar6;
  fd_set *pfVar7;
  value_type *pvVar8;
  undefined7 extraout_var;
  size_t sVar9;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar10;
  long lVar12;
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *pkVar13;
  wchar_t *pwVar14;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
  *this_00;
  supertype *psVar15;
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *i;
  const_object_iterator cVar16;
  type tVar17;
  string_view_type sVar18;
  uint in_stack_00000008;
  int64_t n;
  path_node_type *local_80;
  allocator<char> local_71;
  basic_path_node<wchar_t> *local_70;
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_68;
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_60;
  identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_58;
  undefined1 local_50 [16];
  __normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  local_40;
  bool local_38;
  _func_int **pp_Var11;
  
  this_00 = (eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
             *)CONCAT44(in_register_00000034,__nfds);
  bVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     __exceptfds);
  pfVar7 = __exceptfds;
  if (bVar4) {
    local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
    local_50._0_8_ = (this->identifier_)._M_string_length;
    local_58 = this;
    cVar16 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                       ((basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)
                        __exceptfds,(string_view_type *)local_50);
    local_68 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)cVar16.it_._M_current;
    pcVar6 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
             object_range_abi_cxx11_
                       ((const_object_range_type *)local_50,
                        (basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)
                        __exceptfds);
    pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *)CONCAT71((int7)((ulong)pcVar6 >> 8),local_38);
    if ((((undefined1  [16])cVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       ((local_38 & 1U) == 0)) {
      bVar4 = cVar16.has_value_ == local_38;
    }
    else {
      bVar4 = local_68 == local_40._M_current;
      pkVar13 = local_68;
    }
    if (bVar4) goto LAB_00403816;
    local_50._8_8_ = (local_58->identifier_)._M_dataplus._M_p;
    local_50._0_8_ = (local_58->identifier_)._M_string_length;
    if ((in_stack_00000008 & 0xb) != 0) {
      local_70 = (basic_path_node<wchar_t> *)__writefds;
      __writefds = (fd_set *)
                   eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                   ::
                   create_path_node<jsoncons::jsonpath::basic_path_node<wchar_t>const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&>
                             (this_00,&local_70,
                              (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_50);
    }
    pvVar8 = &local_68->value_;
    psVar15 = (local_58->
              super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              ).tail_;
    if (psVar15 == (supertype *)0x0) {
      lVar12 = __timeout->tv_sec;
LAB_0040380d:
      pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)(**(code **)(lVar12 + 0x10))(__timeout,__writefds,pvVar8);
      goto LAB_00403816;
    }
    pp_Var11 = psVar15->_vptr_jsonpath_selector;
  }
  else {
    while (uVar5 = (byte)pfVar7->fds_bits[0] & 0xf, uVar5 - 8 < 2) {
      pfVar7 = (fd_set *)pfVar7->fds_bits[1];
    }
    if (uVar5 == 0xe) {
      local_60 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)0x0;
      tVar17 = jsoncons::detail::dec_to_integer<long,wchar_t>
                         ((this->identifier_)._M_dataplus._M_p,(this->identifier_)._M_string_length,
                          (long *)&local_60);
      pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)tVar17.ptr;
      if (tVar17.ec == success) {
        i = local_60;
        if ((long)local_60 < 0) {
          sVar9 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             __exceptfds);
          i = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *)((long)&(local_60->key_)._M_dataplus._M_p + sVar9);
        }
        pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                               ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>
                                 *)__exceptfds);
        if (i < pkVar13) {
          local_80 = (path_node_type *)__writefds;
          local_50._0_8_ = i;
          if ((in_stack_00000008 & 0xb) != 0) {
            local_70 = (basic_path_node<wchar_t> *)__writefds;
            local_80 = eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                       ::
                       create_path_node<jsoncons::jsonpath::basic_path_node<wchar_t>const*,unsigned_long&>
                                 (this_00,&local_70,(unsigned_long *)local_50);
          }
          pbVar10 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>
                                *)__exceptfds,(size_t)i);
          psVar15 = (this->
                    super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    ).tail_;
          if (psVar15 == (supertype *)0x0) {
            pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *)(**(code **)(__timeout->tv_sec + 0x10))(__timeout,local_80,pbVar10);
          }
          else {
            uVar5 = (*psVar15->_vptr_jsonpath_selector[2])
                              (psVar15,this_00,__readfds,local_80,pbVar10,__timeout,
                               in_stack_00000008);
            pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       *)(ulong)uVar5;
          }
        }
        goto LAB_00403816;
      }
      sVar2 = (this->identifier_)._M_string_length;
      if (sVar2 != *(size_t *)(this_00 + 0x78)) goto LAB_00403816;
      if (sVar2 != 0) {
        uVar5 = wmemcmp((this->identifier_)._M_dataplus._M_p,*(wchar_t **)(this_00 + 0x70),sVar2);
        pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)(ulong)uVar5;
        if (uVar5 != 0) goto LAB_00403816;
      }
      basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)__exceptfds)
      ;
      local_50._0_8_ =
           basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                     ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                      __exceptfds);
      local_70 = (basic_path_node<wchar_t> *)((ulong)local_70 & 0xffffffffffffff00);
      pvVar8 = eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
               ::create_json<unsigned_long,jsoncons::semantic_tag,std::allocator<char>>
                         (this_00,(unsigned_long *)local_50,(semantic_tag *)&local_70,&local_71);
      local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
      local_50._0_8_ = (this->identifier_)._M_string_length;
      if ((in_stack_00000008 & 0xb) != 0) {
        local_70 = (basic_path_node<wchar_t> *)__writefds;
        __writefds = (fd_set *)
                     eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                     ::
                     create_path_node<jsoncons::jsonpath::basic_path_node<wchar_t>const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&>
                               (this_00,&local_70,
                                (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_50);
      }
      psVar15 = (this->
                super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ).tail_;
      if (psVar15 == (supertype *)0x0) goto LAB_00403806;
      pp_Var11 = psVar15->_vptr_jsonpath_selector;
    }
    else {
      bVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __exceptfds);
      pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)CONCAT71(extraout_var,bVar4);
      if ((!bVar4) ||
         (sVar2 = (this->identifier_)._M_string_length, sVar2 != *(size_t *)(this_00 + 0x78)))
      goto LAB_00403816;
      if (sVar2 != 0) {
        uVar5 = wmemcmp((this->identifier_)._M_dataplus._M_p,*(wchar_t **)(this_00 + 0x70),sVar2);
        pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)(ulong)uVar5;
        if (uVar5 != 0) goto LAB_00403816;
      }
      sVar18 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                         ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          __exceptfds);
      pwVar14 = sVar18._M_str;
      pwVar1 = pwVar14 + sVar18._M_len;
      if ((long)sVar18._M_len < 1) {
        pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)0x0;
      }
      else {
        pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)0x0;
        do {
          local_60 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)0x0;
          if ((0x10ffff < (uint)*pwVar14) || ((*pwVar14 & 0xfffff800U) == 0xd800))
          goto LAB_00403782;
          pwVar14 = pwVar14 + 1;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pwVar14;
          sVar18 = (string_view_type)(auVar3 << 0x40);
          pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     *)((long)&(pkVar13->key_)._M_dataplus._M_p + 1);
        } while (pwVar14 < pwVar1);
      }
      local_60 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)0x0;
      if (sVar18._M_str == pwVar1) {
        local_60 = pkVar13;
      }
LAB_00403782:
      local_50._0_8_ = local_50._0_8_ & 0xffffffffffffff00;
      pvVar8 = eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
               ::create_json<unsigned_long&,jsoncons::semantic_tag,std::allocator<char>>
                         (this_00,(unsigned_long *)&local_60,local_50,(allocator<char> *)&local_70);
      local_50._8_8_ = (this->identifier_)._M_dataplus._M_p;
      local_50._0_8_ = (this->identifier_)._M_string_length;
      if ((in_stack_00000008 & 0xb) != 0) {
        local_70 = (basic_path_node<wchar_t> *)__writefds;
        __writefds = (fd_set *)
                     eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                     ::
                     create_path_node<jsoncons::jsonpath::basic_path_node<wchar_t>const*,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&>
                               (this_00,&local_70,
                                (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_50);
      }
      psVar15 = (this->
                super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                ).tail_;
      if (psVar15 == (supertype *)0x0) {
LAB_00403806:
        lVar12 = __timeout->tv_sec;
        goto LAB_0040380d;
      }
      pp_Var11 = psVar15->_vptr_jsonpath_selector;
    }
  }
  uVar5 = (*pp_Var11[2])(psVar15,this_00,__readfds,__writefds,pvVar8,__timeout,in_stack_00000008);
  pkVar13 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             *)(ulong)uVar5;
LAB_00403816:
  return (int)pkVar13;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
            reference root,
            const path_node_type& last, 
            reference current,
            node_receiver_type& receiver,
            result_options options) const override
        {
            if (current.is_object())
            {
                auto it = current.find(identifier_);
                if (it != current.object_range().end())
                {
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, identifier_, options),
                                        (*it).value(), receiver, options);
                }
            }
            else if (current.is_array())
            {
                int64_t n{0};
                auto r = jsoncons::detail::dec_to_integer(identifier_.data(), identifier_.size(), n);
                if (r)
                {
                    auto index = (n >= 0) ? static_cast<std::size_t>(n) : static_cast<std::size_t>(static_cast<int64_t>(current.size()) + n);
                    if (index < current.size())
                    {
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, index, options),
                                            current[index], receiver, options);
                    }
                }
                else if (identifier_ == context.length_label() && current.size() >= 0)
                {
                    pointer ptr = context.create_json(current.size(), semantic_tag::none, context.get_allocator());
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, identifier_, options), 
                                        *ptr, 
                                        receiver, options);
                }
            }
            else if (current.is_string() && identifier_ == context.length_label())
            {
                string_view_type sv = current.as_string_view();
                std::size_t count = unicode_traits::count_codepoints(sv.data(), sv.size());
                pointer ptr = context.create_json(count, semantic_tag::none, context.get_allocator());
                this->tail_select(context, root, 
                                    path_generator_type::generate(context, last, identifier_, options), 
                                    *ptr, receiver, options);
            }
            //std::cout << "end identifier_selector\n";
        }